

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O1

png_charp png_format_number(png_const_charp start,png_charp end,int format,png_alloc_size_t number)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  png_charp pcVar5;
  ulong uVar6;
  int iVar7;
  
  end[-1] = '\0';
  pcVar5 = end + -1;
  if (start < pcVar5) {
    iVar7 = 1;
    bVar1 = false;
    iVar4 = 0;
    do {
      if (iVar7 <= iVar4 && number == 0) {
        return pcVar5;
      }
      switch(format) {
      case 2:
        iVar7 = 2;
      case 1:
        uVar6 = number / 10;
        pcVar5[-1] = "0123456789ABCDEF"[number % 10];
        pcVar5 = pcVar5 + -1;
        break;
      case 4:
        iVar7 = 2;
      case 3:
        pcVar5[-1] = "0123456789ABCDEF"[(uint)number & 0xf];
        pcVar5 = pcVar5 + -1;
        uVar6 = number >> 4;
        break;
      case 5:
        lVar3 = number + (number / 5 & 0xfffffffffffffffe) * -5;
        if (bVar1 || lVar3 != 0) {
          pcVar5[-1] = "0123456789ABCDEF"[lVar3];
          pcVar5 = pcVar5 + -1;
        }
        bVar1 = bVar1 || lVar3 != 0;
        uVar6 = number / 10;
        iVar7 = 5;
        break;
      default:
        uVar6 = 0;
      }
      if (((format == 5) && (iVar4 == 4)) && (start < pcVar5)) {
        cVar2 = '.';
        if (!bVar1) {
          if (uVar6 != 0) goto LAB_0010959d;
          cVar2 = '0';
        }
        pcVar5[-1] = cVar2;
        pcVar5 = pcVar5 + -1;
      }
LAB_0010959d:
      iVar4 = iVar4 + 1;
      number = uVar6;
    } while (start < pcVar5);
  }
  return pcVar5;
}

Assistant:

png_charp
png_format_number(png_const_charp start, png_charp end, int format,
    png_alloc_size_t number)
{
   int count = 0;    /* number of digits output */
   int mincount = 1; /* minimum number required */
   int output = 0;   /* digit output (for the fixed point format) */

   *--end = '\0';

   /* This is written so that the loop always runs at least once, even with
    * number zero.
    */
   while (end > start && (number != 0 || count < mincount))
   {

      static const char digits[] = "0123456789ABCDEF";

      switch (format)
      {
         case PNG_NUMBER_FORMAT_fixed:
            /* Needs five digits (the fraction) */
            mincount = 5;
            if (output != 0 || number % 10 != 0)
            {
               *--end = digits[number % 10];
               output = 1;
            }
            number /= 10;
            break;

         case PNG_NUMBER_FORMAT_02u:
            /* Expects at least 2 digits. */
            mincount = 2;
            /* FALLTHROUGH */

         case PNG_NUMBER_FORMAT_u:
            *--end = digits[number % 10];
            number /= 10;
            break;

         case PNG_NUMBER_FORMAT_02x:
            /* This format expects at least two digits */
            mincount = 2;
            /* FALLTHROUGH */

         case PNG_NUMBER_FORMAT_x:
            *--end = digits[number & 0xf];
            number >>= 4;
            break;

         default: /* an error */
            number = 0;
            break;
      }

      /* Keep track of the number of digits added */
      ++count;

      /* Float a fixed number here: */
      if ((format == PNG_NUMBER_FORMAT_fixed) && (count == 5) && (end > start))
      {
         /* End of the fraction, but maybe nothing was output?  In that case
          * drop the decimal point.  If the number is a true zero handle that
          * here.
          */
         if (output != 0)
            *--end = '.';
         else if (number == 0) /* and !output */
            *--end = '0';
      }
   }

   return end;
}